

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
upb::generator::(anonymous_namespace)::StrongReferenceSingle_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr field)

{
  upb_MessageDef *puVar1;
  char *__s;
  generator *this_00;
  char *in_RCX;
  string_view full_name;
  string local_48;
  size_type local_28;
  pointer local_20;
  
  puVar1 = upb_FieldDef_MessageSubDef((upb_FieldDef *)this);
  if (puVar1 == (upb_MessageDef *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    puVar1 = upb_FieldDef_MessageSubDef((upb_FieldDef *)this);
    __s = upb_MessageDef_FullName(puVar1);
    this_00 = (generator *)strlen(__s);
    full_name._M_str = in_RCX;
    full_name._M_len = (size_t)__s;
    MiniTableMessageVarName_abi_cxx11_(&local_48,this_00,full_name);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_28 = local_48._M_string_length;
    local_20 = local_48._M_dataplus._M_p;
    absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
              (__return_storage_ptr__,0x32,"  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&$0)",
               &local_28,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrongReferenceSingle(upb::FieldDefPtr field) {
  if (!field.message_type()) return "";
  return absl::Substitute(
      "  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&$0)",
      MiniTableMessageVarName(field.message_type().full_name()));
}